

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlUTF8Strloc(xmlChar *utf,xmlChar *utfchar)

{
  byte bVar1;
  int len;
  int iVar2;
  ulong uVar3;
  
  if (utfchar != (xmlChar *)0x0 && utf != (xmlChar *)0x0) {
    len = xmlUTF8Strsize(utfchar,1);
    uVar3 = 0;
    while (bVar1 = *utf, bVar1 != 0) {
      iVar2 = xmlStrncmp(utf,utfchar,len);
      if (iVar2 == 0) {
        if (uVar3 < 0x80000000) {
          return (int)uVar3;
        }
        return 0;
      }
      utf = utf + 1;
      if ((char)bVar1 < '\0') {
        if ((~bVar1 & 0xc0) != 0) {
          return -1;
        }
        if ((bVar1 & 0x40) != 0) {
          return -1;
        }
      }
      uVar3 = uVar3 + 1;
    }
  }
  return -1;
}

Assistant:

int
xmlUTF8Strloc(const xmlChar *utf, const xmlChar *utfchar) {
    size_t i;
    int size;
    int ch;

    if (utf==NULL || utfchar==NULL) return -1;
    size = xmlUTF8Strsize(utfchar, 1);
        for(i=0; (ch=*utf) != 0; i++) {
            if (xmlStrncmp(utf, utfchar, size)==0)
                return(i > INT_MAX ? 0 : i);
            utf++;
            if ( ch & 0x80 ) {
                /* if not simple ascii, verify proper format */
                if ( (ch & 0xc0) != 0xc0 )
                    return(-1);
                /* then skip over remaining bytes for this char */
                while ( (ch <<= 1) & 0x80 )
                    if ( (*utf++ & 0xc0) != 0x80 )
                        return(-1);
            }
        }

    return(-1);
}